

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

AssetInfo * __thiscall
tinyusdz::PrimMetas::get_assetInfo
          (AssetInfo *__return_storage_ptr__,PrimMetas *this,bool *is_authored)

{
  _Rb_tree_header *p_Var1;
  Dictionary *this_00;
  bool bVar2;
  Dictionary *__x;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  pVar3;
  MetaVariable identifier_var;
  MetaVariable name_var;
  string identifier;
  storage_union local_d0;
  undefined **local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  undefined8 local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  storage_union local_98;
  undefined **local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  (__return_storage_ptr__->identifier).asset_path_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->identifier).asset_path_.field_2;
  (__return_storage_ptr__->identifier).asset_path_._M_string_length = 0;
  (__return_storage_ptr__->identifier).asset_path_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->identifier).resolved_path_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->identifier).resolved_path_.field_2;
  (__return_storage_ptr__->identifier).resolved_path_._M_string_length = 0;
  (__return_storage_ptr__->identifier).resolved_path_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->payloadAssetDependencies).
  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->payloadAssetDependencies).
  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->payloadAssetDependencies).
  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->version)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->version).field_2;
  (__return_storage_ptr__->version)._M_string_length = 0;
  (__return_storage_ptr__->version).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->_fields)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (is_authored != (bool *)0x0) {
    bVar2 = authored(this);
    *is_authored = bVar2;
  }
  bVar2 = authored(this);
  if (bVar2) {
    __x = &this->meta;
    this_00 = &__return_storage_ptr__->_fields;
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::operator=(&this_00->_M_t,&__x->_M_t);
    local_c0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_d0.dynamic = (void *)0x0;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_b8 = &local_a8;
    local_98.dynamic = &local_88;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"identifier","");
    bVar2 = GetCustomDataByKey(__x,(string *)&local_98,(MetaVariable *)&local_d0);
    if ((undefined ***)local_98.dynamic != &local_88) {
      operator_delete(local_98.dynamic,(long)local_88 + 1);
    }
    if (bVar2) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity =
           local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar2 = MetaVariable::get_value<std::__cxx11::string>((MetaVariable *)&local_d0,&local_58);
      if (bVar2) {
        local_38 = (string *)&(__return_storage_ptr__->identifier).resolved_path_;
        local_98.dynamic = &local_88;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_58._M_dataplus._M_p,
                   local_58._M_dataplus._M_p + local_58._M_string_length);
        local_70._M_allocated_capacity = 0;
        local_70._M_local_buf[8] = '\0';
        local_78 = local_70._M_local_buf + 8;
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
        ::std::__cxx11::string::operator=(local_38,(string *)&local_78);
        if (local_78 != local_70._M_local_buf + 8) {
          operator_delete(local_78,CONCAT71(local_70._9_7_,local_70._M_local_buf[8]) + 1);
        }
        if ((undefined ***)local_98.dynamic != &local_88) {
          operator_delete(local_98.dynamic,(long)local_88 + 1);
        }
        local_98.dynamic = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"identifier","");
        pVar3 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                ::equal_range(&this_00->_M_t,(key_type *)&local_98);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node
                      );
        if ((undefined ***)local_98.dynamic != &local_88) {
          operator_delete(local_98.dynamic,(long)local_88 + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,
                                        local_a8._M_local_buf[0]) + 1);
    }
    if (local_c0 != (undefined **)0x0) {
      (*(code *)local_c0[4])(&local_d0);
      local_c0 = (undefined **)0x0;
    }
    local_88 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_98.dynamic = (void *)0x0;
    local_78 = (char *)0x0;
    local_70._M_allocated_capacity = local_70._M_allocated_capacity & 0xffffffffffffff00;
    local_d0.dynamic = &local_c0;
    local_80 = &local_70;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"name","");
    bVar2 = GetCustomDataByKey(__x,(string *)&local_d0,(MetaVariable *)&local_98);
    if ((undefined ***)local_d0.dynamic != &local_c0) {
      operator_delete(local_d0.dynamic,(long)local_c0 + 1);
    }
    if (bVar2) {
      local_d0.dynamic = &local_c0;
      local_d0._8_8_ = 0;
      local_c0 = (undefined **)((ulong)local_c0 & 0xffffffffffffff00);
      bVar2 = MetaVariable::get_value<std::__cxx11::string>
                        ((MetaVariable *)&local_98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d0);
      if (bVar2) {
        ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"name","");
        pVar3 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                ::equal_range(&this_00->_M_t,&local_58);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node
                      );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      if ((undefined ***)local_d0.dynamic != &local_c0) {
        operator_delete(local_d0.dynamic,(long)local_c0 + 1);
      }
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70._M_allocated_capacity + 1);
    }
    if (local_88 != (undefined **)0x0) {
      (*(code *)local_88[4])(&local_98);
    }
    local_88 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_98.dynamic = (void *)0x0;
    local_78 = (char *)0x0;
    local_70._M_allocated_capacity = local_70._M_allocated_capacity & 0xffffffffffffff00;
    local_d0.dynamic = &local_c0;
    local_80 = &local_70;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"payloadAssetDependencies","");
    bVar2 = GetCustomDataByKey(__x,(string *)&local_d0,(MetaVariable *)&local_98);
    if ((undefined ***)local_d0.dynamic != &local_c0) {
      operator_delete(local_d0.dynamic,(long)local_c0 + 1);
    }
    if (bVar2) {
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      bVar2 = MetaVariable::
              get_value<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                        ((MetaVariable *)&local_98,
                         (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                          *)&local_58);
      if (bVar2) {
        ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
        operator=(&__return_storage_ptr__->payloadAssetDependencies,
                  (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *
                  )&local_58);
        local_d0.dynamic = &local_c0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"payloadAssetDependencies","");
        pVar3 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                ::equal_range(&this_00->_M_t,(key_type *)&local_d0);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node
                      );
        if ((undefined ***)local_d0.dynamic != &local_c0) {
          operator_delete(local_d0.dynamic,(long)local_c0 + 1);
        }
      }
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
      ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
              &local_58);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70._M_allocated_capacity + 1);
    }
    if (local_88 != (undefined **)0x0) {
      (*(code *)local_88[4])(&local_98);
    }
    local_88 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_98.dynamic = (void *)0x0;
    local_78 = (char *)0x0;
    local_70._M_allocated_capacity = local_70._M_allocated_capacity & 0xffffffffffffff00;
    local_d0.dynamic = &local_c0;
    local_80 = &local_70;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"version","");
    bVar2 = GetCustomDataByKey(__x,(string *)&local_d0,(MetaVariable *)&local_98);
    if ((undefined ***)local_d0.dynamic != &local_c0) {
      operator_delete(local_d0.dynamic,(long)local_c0 + 1);
    }
    if (bVar2) {
      local_d0.dynamic = &local_c0;
      local_d0._8_8_ = 0;
      local_c0 = (undefined **)((ulong)local_c0 & 0xffffffffffffff00);
      bVar2 = MetaVariable::get_value<std::__cxx11::string>
                        ((MetaVariable *)&local_98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d0);
      if (bVar2) {
        ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->version);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"version","");
        pVar3 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                ::equal_range(&this_00->_M_t,&local_58);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node
                      );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      if ((undefined ***)local_d0.dynamic != &local_c0) {
        operator_delete(local_d0.dynamic,(long)local_c0 + 1);
      }
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70._M_allocated_capacity + 1);
    }
    if (local_88 != (undefined **)0x0) {
      (*(code *)local_88[4])(&local_98);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

AssetInfo PrimMeta::get_assetInfo(bool *is_authored) const {
  AssetInfo ainfo;

  if (is_authored) {
    (*is_authored) = authored();
  }

  if (authored()) {
    ainfo._fields = meta;

    {
      MetaVariable identifier_var;
      if (GetCustomDataByKey(meta, "identifier", &identifier_var)) {
        std::string identifier;
        if (identifier_var.get_value<std::string>(&identifier)) {
          ainfo.identifier = identifier;
          ainfo._fields.erase("identifier");
        }
      }
    }

    {
      MetaVariable name_var;
      if (GetCustomDataByKey(meta, "name", &name_var)) {
        std::string name;
        if (name_var.get_value<std::string>(&name)) {
          ainfo.name = name;
          ainfo._fields.erase("name");
        }
      }
    }

    {
      MetaVariable payloadDeps_var;
      if (GetCustomDataByKey(meta, "payloadAssetDependencies",
                             &payloadDeps_var)) {
        std::vector<value::AssetPath> assets;
        if (payloadDeps_var.get_value<std::vector<value::AssetPath>>(&assets)) {
          ainfo.payloadAssetDependencies = assets;
          ainfo._fields.erase("payloadAssetDependencies");
        }
      }
    }

    {
      MetaVariable version_var;
      if (GetCustomDataByKey(meta, "version", &version_var)) {
        std::string version;
        if (version_var.get_value<std::string>(&version)) {
          ainfo.version = version;
          ainfo._fields.erase("version");
        }
      }
    }
  }

  return ainfo;
}